

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

string * __thiscall
cmExtraSublimeTextGenerator::ComputeFlagsForObject_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *gtgt)

{
  pointer pcVar1;
  cmMakefile *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  string *psVar3;
  cmValue cVar4;
  string language;
  string COMPILE_OPTIONS;
  string COMPILE_FLAGS;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  cmGeneratorExpressionInterpreter local_b8;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  
  local_180 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_180;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar3 = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a0,pcVar1,pcVar1 + psVar3->_M_string_length);
  if (local_1a0._M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_1a0,0,(char *)0x0,0x7a87c9);
  }
  cmGeneratorTarget::AddExplicitLanguageFlags(gtgt,__return_storage_ptr__,source);
  this_00 = lg->Makefile;
  p_Var2 = &local_b8.GeneratorExpression.Backtrace.
            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_b8.GeneratorExpression.CMakeInstance = (cmake *)p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_BUILD_TYPE","");
  psVar3 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_b8);
  if (local_b8.GeneratorExpression.CMakeInstance != (cmake *)p_Var2) {
    operator_delete(local_b8.GeneratorExpression.CMakeInstance,
                    (ulong)((long)&(local_b8.GeneratorExpression.Backtrace.
                                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                    TopEntry.
                                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  cmLocalGenerator::GetTargetCompileFlags
            (&local_48,lg,gtgt,psVar3,&local_1a0,__return_storage_ptr__);
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar1,pcVar1 + psVar3->_M_string_length);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,local_1a0._M_dataplus._M_p,
             local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_b8,lg,&local_d8,gtgt,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"COMPILE_FLAGS","");
  cVar4 = cmSourceFile::GetProperty(source,&local_158);
  if (cVar4.Value != (string *)0x0) {
    pcVar1 = ((cVar4.Value)->_M_dataplus)._M_p;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar1,pcVar1 + (cVar4.Value)->_M_string_length);
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate(&local_b8,&local_118,&local_158);
    (*(lg->super_cmOutputConverter)._vptr_cmOutputConverter[7])(lg,__return_storage_ptr__,psVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"COMPILE_OPTIONS","");
  cVar4 = cmSourceFile::GetProperty(source,&local_178);
  if (cVar4.Value != (string *)0x0) {
    pcVar1 = ((cVar4.Value)->_M_dataplus)._M_p;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,pcVar1,pcVar1 + (cVar4.Value)->_M_string_length);
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate(&local_b8,&local_138,&local_178);
    cmLocalGenerator::AppendCompileOptions(lg,__return_storage_ptr__,psVar3,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.Language._M_dataplus._M_p != &local_b8.Language.field_2) {
    operator_delete(local_b8.Language._M_dataplus._M_p,
                    local_b8.Language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.Config._M_dataplus._M_p != &local_b8.Config.field_2) {
    operator_delete(local_b8.Config._M_dataplus._M_p,
                    local_b8.Config.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_b8.CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&local_b8.GeneratorExpression);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeFlagsForObject(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* gtgt)
{
  std::string flags;
  std::string language = source->GetOrDetermineLanguage();
  if (language.empty()) {
    language = "C";
  }

  // Explicitly add the explicit language flag before any other flag
  // so user flags can override it.
  gtgt->AddExplicitLanguageFlags(flags, *source);

  std::string const& config =
    lg->GetMakefile()->GetSafeDefinition("CMAKE_BUILD_TYPE");

  lg->GetTargetCompileFlags(gtgt, config, language, flags);

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, gtgt,
                                                    language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (cmValue cflags = source->GetProperty(COMPILE_FLAGS)) {
    lg->AppendFlags(flags, genexInterpreter.Evaluate(*cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (cmValue coptions = source->GetProperty(COMPILE_OPTIONS)) {
    lg->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(*coptions, COMPILE_OPTIONS));
  }

  return flags;
}